

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.hpp
# Opt level: O2

string * __thiscall
duckdb::ErrorManager::FormatException<std::__cxx11::string>
          (string *__return_storage_ptr__,ErrorManager *this,ClientContext *context,
          ErrorType error_type,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  ErrorManager *this_00;
  undefined6 in_register_0000000a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  this_00 = Get((ClientContext *)this);
  ::std::__cxx11::string::string
            ((string *)&bStack_48,(string *)CONCAT62(in_register_0000000a,error_type));
  FormatException<std::__cxx11::string>
            (__return_storage_ptr__,this_00,(ErrorType)context,&bStack_48);
  ::std::__cxx11::string::~string((string *)&bStack_48);
  return __return_storage_ptr__;
}

Assistant:

static string FormatException(ClientContext &context, ErrorType error_type, ARGS... params) {
		return Get(context).FormatException(error_type, params...);
	}